

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void Assimp::Write(JSONWriter *out,aiQuaternion *ai,bool is_elem)

{
  JSONWriter::StartArray(out,is_elem);
  JSONWriter::Element<float>(out,&ai->w);
  JSONWriter::Element<float>(out,&ai->x);
  JSONWriter::Element<float>(out,&ai->y);
  JSONWriter::Element<float>(out,&ai->z);
  JSONWriter::EndArray(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiQuaternion& ai, bool is_elem = true) {
    out.StartArray(is_elem);
    out.Element(ai.w);
    out.Element(ai.x);
    out.Element(ai.y);
    out.Element(ai.z);
    out.EndArray();
}